

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_values.cpp
# Opt level: O1

ON_SHA1_Hash * __thiscall
ON_ScaleValue::ContentHash(ON_SHA1_Hash *__return_storage_ptr__,ON_ScaleValue *this)

{
  ON_SHA1_Hash h;
  ON_SHA1_Hash local_d8;
  ON_SHA1_Hash local_bc;
  ON_SHA1 local_a8;
  
  local_a8.m_state[2] = 0;
  local_a8.m_state[3] = 0;
  local_a8.m_state[4] = 0;
  local_a8.m_bit_count[0] = 0;
  local_a8.m_bit_count[1] = 0;
  local_a8.m_state[0] = 0;
  local_a8.m_state[1] = 0;
  local_a8.m_buffer[0x30] = '\0';
  local_a8.m_buffer[0x31] = '\0';
  local_a8.m_buffer[0x32] = '\0';
  local_a8.m_buffer[0x33] = '\0';
  local_a8.m_buffer[0x34] = '\0';
  local_a8.m_buffer[0x35] = '\0';
  local_a8.m_buffer[0x36] = '\0';
  local_a8.m_buffer[0x37] = '\0';
  local_a8.m_buffer[0x38] = '\0';
  local_a8.m_buffer[0x39] = '\0';
  local_a8.m_buffer[0x3a] = '\0';
  local_a8.m_buffer[0x3b] = '\0';
  local_a8.m_buffer[0x3c] = '\0';
  local_a8.m_buffer[0x3d] = '\0';
  local_a8.m_buffer[0x3e] = '\0';
  local_a8.m_buffer[0x3f] = '\0';
  local_a8.m_buffer[0x20] = '\0';
  local_a8.m_buffer[0x21] = '\0';
  local_a8.m_buffer[0x22] = '\0';
  local_a8.m_buffer[0x23] = '\0';
  local_a8.m_buffer[0x24] = '\0';
  local_a8.m_buffer[0x25] = '\0';
  local_a8.m_buffer[0x26] = '\0';
  local_a8.m_buffer[0x27] = '\0';
  local_a8.m_buffer[0x28] = '\0';
  local_a8.m_buffer[0x29] = '\0';
  local_a8.m_buffer[0x2a] = '\0';
  local_a8.m_buffer[0x2b] = '\0';
  local_a8.m_buffer[0x2c] = '\0';
  local_a8.m_buffer[0x2d] = '\0';
  local_a8.m_buffer[0x2e] = '\0';
  local_a8.m_buffer[0x2f] = '\0';
  local_a8.m_buffer[0x10] = '\0';
  local_a8.m_buffer[0x11] = '\0';
  local_a8.m_buffer[0x12] = '\0';
  local_a8.m_buffer[0x13] = '\0';
  local_a8.m_buffer[0x14] = '\0';
  local_a8.m_buffer[0x15] = '\0';
  local_a8.m_buffer[0x16] = '\0';
  local_a8.m_buffer[0x17] = '\0';
  local_a8.m_buffer[0x18] = '\0';
  local_a8.m_buffer[0x19] = '\0';
  local_a8.m_buffer[0x1a] = '\0';
  local_a8.m_buffer[0x1b] = '\0';
  local_a8.m_buffer[0x1c] = '\0';
  local_a8.m_buffer[0x1d] = '\0';
  local_a8.m_buffer[0x1e] = '\0';
  local_a8.m_buffer[0x1f] = '\0';
  local_a8.m_buffer[0] = '\0';
  local_a8.m_buffer[1] = '\0';
  local_a8.m_buffer[2] = '\0';
  local_a8.m_buffer[3] = '\0';
  local_a8.m_buffer[4] = '\0';
  local_a8.m_buffer[5] = '\0';
  local_a8.m_buffer[6] = '\0';
  local_a8.m_buffer[7] = '\0';
  local_a8.m_buffer[8] = '\0';
  local_a8.m_buffer[9] = '\0';
  local_a8.m_buffer[10] = '\0';
  local_a8.m_buffer[0xb] = '\0';
  local_a8.m_buffer[0xc] = '\0';
  local_a8.m_buffer[0xd] = '\0';
  local_a8.m_buffer[0xe] = '\0';
  local_a8.m_buffer[0xf] = '\0';
  local_a8.m_byte_count = 0;
  local_a8.m_status_bits = 0;
  local_a8.m_reserved = 0;
  ON_SHA1_Hash::ON_SHA1_Hash(&local_a8.m_sha1_hash);
  ON_SHA1::AccumulateDouble(&local_a8,this->m_left_to_right_scale);
  ON_SHA1::AccumulateDouble(&local_a8,this->m_right_to_left_scale);
  ON_SHA1::AccumulateUnsigned32(&local_a8,this->m_context_locale_id);
  ON_SHA1::AccumulateUnsigned32(&local_a8,(uint)this->m_context_length_unit_system);
  ON_SHA1::AccumulateUnsigned32(&local_a8,(uint)this->m_context_angle_unit_system);
  ON_SHA1::AccumulateUnsigned32(&local_a8,(uint)this->m_string_format_preference);
  ON_wString::IsValid(&this->m_scale_as_string,true);
  ON_SHA1::AccumulateString(&local_a8,&this->m_scale_as_string);
  ON_LengthValue::ContentHash(&local_d8,&this->m_left_length);
  ON_SHA1::AccumulateSubHash(&local_a8,&local_d8);
  ON_LengthValue::ContentHash(&local_bc,&this->m_right_length);
  local_d8.m_digest[0x10] = local_bc.m_digest[0x10];
  local_d8.m_digest[0x11] = local_bc.m_digest[0x11];
  local_d8.m_digest[0x12] = local_bc.m_digest[0x12];
  local_d8.m_digest[0x13] = local_bc.m_digest[0x13];
  local_d8.m_digest[0] = local_bc.m_digest[0];
  local_d8.m_digest[1] = local_bc.m_digest[1];
  local_d8.m_digest[2] = local_bc.m_digest[2];
  local_d8.m_digest[3] = local_bc.m_digest[3];
  local_d8.m_digest[4] = local_bc.m_digest[4];
  local_d8.m_digest[5] = local_bc.m_digest[5];
  local_d8.m_digest[6] = local_bc.m_digest[6];
  local_d8.m_digest[7] = local_bc.m_digest[7];
  local_d8.m_digest[8] = local_bc.m_digest[8];
  local_d8.m_digest[9] = local_bc.m_digest[9];
  local_d8.m_digest[10] = local_bc.m_digest[10];
  local_d8.m_digest[0xb] = local_bc.m_digest[0xb];
  local_d8.m_digest[0xc] = local_bc.m_digest[0xc];
  local_d8.m_digest[0xd] = local_bc.m_digest[0xd];
  local_d8.m_digest[0xe] = local_bc.m_digest[0xe];
  local_d8.m_digest[0xf] = local_bc.m_digest[0xf];
  ON_SHA1::AccumulateSubHash(&local_a8,&local_d8);
  ON_SHA1::Hash(__return_storage_ptr__,&local_a8);
  return __return_storage_ptr__;
}

Assistant:

const ON_SHA1_Hash ON_ScaleValue::ContentHash() const
{
  ON_SHA1 sha1;
  sha1.AccumulateDouble(m_left_to_right_scale);
  sha1.AccumulateDouble(m_right_to_left_scale);
  sha1.AccumulateUnsigned32(m_context_locale_id);
  sha1.AccumulateUnsigned32(static_cast<unsigned int>(m_context_length_unit_system));
  sha1.AccumulateUnsigned32(static_cast<unsigned int>(m_context_angle_unit_system));
  sha1.AccumulateUnsigned32(static_cast<unsigned int>(m_string_format_preference));
  m_scale_as_string.IsValid(true);
  sha1.AccumulateString(m_scale_as_string);
  ON_SHA1_Hash h = m_left_length.ContentHash();
  sha1.AccumulateSubHash(h);
  h = m_right_length.ContentHash();
  sha1.AccumulateSubHash(h);
  return sha1.Hash();
}